

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O1

FListMenuItem * __thiscall DListMenu::GetItem(DListMenu *this,FName *name)

{
  FListMenuItem *pFVar1;
  FListMenuDescriptor *pFVar2;
  ulong uVar3;
  FName nm;
  int local_2c;
  
  pFVar2 = this->mDesc;
  if ((pFVar2->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count != 0) {
    uVar3 = 0;
    do {
      pFVar1 = (pFVar2->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar3];
      (*pFVar1->_vptr_FListMenuItem[7])(&local_2c,pFVar1,0);
      if (local_2c == name->Index) {
        return (this->mDesc->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar3];
      }
      uVar3 = uVar3 + 1;
      pFVar2 = this->mDesc;
    } while (uVar3 < (pFVar2->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count);
  }
  return (FListMenuItem *)0x0;
}

Assistant:

FListMenuItem *DListMenu::GetItem(FName name)
{
	for(unsigned i=0;i<mDesc->mItems.Size(); i++)
	{
		FName nm = mDesc->mItems[i]->GetAction(NULL);
		if (nm == name) return mDesc->mItems[i];
	}
	return NULL;
}